

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::benchmarkEnded(ConsoleReporter *this,BenchmarkStats *stats)

{
  TablePrinter *pTVar1;
  ulong uVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  uVar2 = stats->elapsedTimeInNanoseconds / stats->iterations;
  iVar4 = 1;
  if (((999 < uVar2) && (iVar4 = 2, 999999 < uVar2)) && (iVar4 = 3, 999999999 < uVar2)) {
    iVar4 = 5 - (uint)(uVar2 >> 0xb < 0x1bf08eb);
  }
  pTVar1 = (this->m_tablePrinter)._M_t.
           super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
           _M_t.
           super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
           super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  std::ostream::_M_insert<unsigned_long>((ulong)&pTVar1->m_oss);
  operator<<(pTVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)&pTVar1->m_oss);
  operator<<(pTVar1);
  auVar6._8_4_ = (int)(uVar2 >> 0x20);
  auVar6._0_8_ = uVar2;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  switch(iVar4) {
  case 2:
    dVar5 = dVar5 / 1000.0;
    break;
  case 3:
    dVar5 = dVar5 / 1000000.0;
    break;
  case 4:
    dVar5 = dVar5 / 1000000000.0;
    break;
  case 5:
    dVar5 = dVar5 / 60000000000.0;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  (*(code *)(&DAT_0016b1b4 + *(int *)(&DAT_0016b1b4 + (ulong)(iVar4 - 1) * 4)))();
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats const& stats) {
    Duration average(stats.elapsedTimeInNanoseconds / stats.iterations);
    (*m_tablePrinter)
        << stats.iterations << ColumnBreak()
        << stats.elapsedTimeInNanoseconds << ColumnBreak()
        << average << ColumnBreak();
}